

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuConfig.cpp
# Opt level: O2

void __thiscall xmrig::CpuConfig::generate(CpuConfig *this)

{
  uint uVar1;
  bool bVar2;
  ICpuInfo *pIVar3;
  size_t sVar4;
  CpuThreads CStack_48;
  
  if (this->m_enabled == true) {
    bVar2 = Threads<xmrig::CpuThreads>::has(&this->m_threads);
    if (!bVar2) {
      uVar1 = this->m_limit;
      pIVar3 = Cpu::info();
      (*pIVar3->_vptr_ICpuInfo[7])(&CStack_48,pIVar3,(ulong)uVar1);
      sVar4 = Threads<xmrig::CpuThreads>::move(&this->m_threads,"cn/blur",&CStack_48);
      std::_Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::~_Vector_base
                (&CStack_48.m_data.
                  super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>);
      this->m_shouldSave = sVar4 != 0;
    }
  }
  return;
}

Assistant:

void xmrig::CpuConfig::generate()
{
    if (!isEnabled() || m_threads.has()) {
        return;
    }

    size_t count = 0;

    count += xmrig::generate(m_threads, m_limit);
    m_shouldSave = count > 0;
}